

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Thermo.cpp
# Opt level: O0

void __thiscall OpenMD::Thermo::getComAll(Thermo *this,Vector3d *com,Vector3d *comVel)

{
  SnapshotManager *this_00;
  Vector3<double> *in_RDI;
  Snapshot *v1;
  RealType mass;
  RealType totalMass;
  Molecule *mol;
  MoleculeIterator i;
  Snapshot *snap;
  Snapshot *in_stack_fffffffffffffed8;
  Snapshot *in_stack_fffffffffffffee0;
  Molecule *in_stack_fffffffffffffef0;
  MoleculeIterator *in_stack_fffffffffffffef8;
  SimInfo *in_stack_ffffffffffffff00;
  Molecule *in_stack_ffffffffffffff38;
  double local_78;
  Vector<double,_3U> local_70;
  double local_58;
  Vector<double,_3U> local_50;
  double local_38;
  Molecule *local_30;
  _Rb_tree_iterator<std::pair<const_int,_OpenMD::Molecule_*>_> local_28;
  Snapshot *local_20;
  
  this_00 = SimInfo::getSnapshotManager((SimInfo *)(in_RDI->super_Vector<double,_3U>).data_[0]);
  local_20 = SnapshotManager::getCurrentSnapshot(this_00);
  if (((local_20->hasCOM & 1U) == 0) || ((local_20->hasCOMvel & 1U) == 0)) {
    std::_Rb_tree_iterator<std::pair<const_int,_OpenMD::Molecule_*>_>::_Rb_tree_iterator(&local_28);
    local_38 = 0.0;
    local_58 = 0.0;
    Vector<double,_3U>::Vector(&local_50,&local_58);
    Vector3<double>::operator=(in_RDI,(Vector<double,_3U> *)in_stack_fffffffffffffee0);
    local_78 = 0.0;
    Vector<double,_3U>::Vector(&local_70,&local_78);
    Vector3<double>::operator=(in_RDI,(Vector<double,_3U> *)in_stack_fffffffffffffee0);
    local_30 = SimInfo::beginMolecule(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
    while (local_30 != (Molecule *)0x0) {
      v1 = (Snapshot *)Molecule::getMass(in_stack_fffffffffffffef0);
      local_38 = (double)v1 + local_38;
      in_stack_fffffffffffffed8 = v1;
      Molecule::getCom(in_stack_ffffffffffffff38);
      OpenMD::operator*((double)in_RDI,(Vector<double,_3U> *)in_stack_fffffffffffffee0);
      Vector<double,_3U>::operator+=
                ((Vector<double,_3U> *)in_stack_fffffffffffffee0,
                 (Vector<double,_3U> *)in_stack_fffffffffffffed8);
      Molecule::getComVel(in_stack_ffffffffffffff38);
      OpenMD::operator*((double)in_RDI,(Vector<double,_3U> *)v1);
      Vector<double,_3U>::operator+=
                ((Vector<double,_3U> *)v1,(Vector<double,_3U> *)in_stack_fffffffffffffed8);
      local_30 = SimInfo::nextMolecule(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
      in_stack_fffffffffffffee0 = v1;
    }
    Vector<double,_3U>::operator/=
              ((Vector<double,_3U> *)in_stack_fffffffffffffee0,(double)in_stack_fffffffffffffed8);
    Vector<double,_3U>::operator/=
              ((Vector<double,_3U> *)in_stack_fffffffffffffee0,(double)in_stack_fffffffffffffed8);
    Snapshot::setCOM(in_stack_fffffffffffffee0,(Vector3d *)in_stack_fffffffffffffed8);
    Snapshot::setCOMvel(in_stack_fffffffffffffee0,(Vector3d *)in_stack_fffffffffffffed8);
  }
  Snapshot::getCOM(in_stack_fffffffffffffed8);
  Vector3<double>::operator=
            ((Vector3<double> *)in_stack_fffffffffffffee0,
             (Vector3<double> *)in_stack_fffffffffffffed8);
  Snapshot::getCOMvel(in_stack_fffffffffffffed8);
  Vector3<double>::operator=
            ((Vector3<double> *)in_stack_fffffffffffffee0,
             (Vector3<double> *)in_stack_fffffffffffffed8);
  return;
}

Assistant:

void Thermo::getComAll(Vector3d& com, Vector3d& comVel) {
    Snapshot* snap = info_->getSnapshotManager()->getCurrentSnapshot();

    if (!(snap->hasCOM && snap->hasCOMvel)) {
      SimInfo::MoleculeIterator i;
      Molecule* mol;

      RealType totalMass(0.0);

      com    = 0.0;
      comVel = 0.0;

      for (mol = info_->beginMolecule(i); mol != NULL;
           mol = info_->nextMolecule(i)) {
        RealType mass = mol->getMass();
        totalMass += mass;
        com += mass * mol->getCom();
        comVel += mass * mol->getComVel();
      }

#ifdef IS_MPI
      MPI_Allreduce(MPI_IN_PLACE, &totalMass, 1, MPI_REALTYPE, MPI_SUM,
                    MPI_COMM_WORLD);
      MPI_Allreduce(MPI_IN_PLACE, com.getArrayPointer(), 3, MPI_REALTYPE,
                    MPI_SUM, MPI_COMM_WORLD);
      MPI_Allreduce(MPI_IN_PLACE, comVel.getArrayPointer(), 3, MPI_REALTYPE,
                    MPI_SUM, MPI_COMM_WORLD);
#endif

      com /= totalMass;
      comVel /= totalMass;
      snap->setCOM(com);
      snap->setCOMvel(comVel);
    }
    com    = snap->getCOM();
    comVel = snap->getCOMvel();
    return;
  }